

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O2

void __thiscall Map::showMapWithOwners(Map *this)

{
  ostream *poVar1;
  string *psVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  string local_50;
  
  lVar3 = 0;
  lVar4 = 0;
  for (lVar5 = 0; lVar5 < this->gameMap->vertexCount; lVar5 = lVar5 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar5);
    poVar1 = std::operator<<(poVar1,". ");
    GraphVertex<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    toString(&local_50,
             (GraphVertex<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&this->gameMap->vertexList->index + lVar4));
    poVar1 = std::operator<<(poVar1,(string *)&local_50);
    poVar1 = std::operator<<(poVar1," --> {");
    psVar2 = Player::getPlayerName_abi_cxx11_
                       (*(Player **)
                         ((long)&((this->regionOwners).
                                  super__Vector_base<std::pair<Player_*,_Player_*>,_std::allocator<std::pair<Player_*,_Player_*>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->first + lVar3));
    poVar1 = std::operator<<(poVar1,(string *)psVar2);
    poVar1 = std::operator<<(poVar1," , ");
    psVar2 = Player::getPlayerName_abi_cxx11_
                       (*(Player **)
                         ((long)&((this->regionOwners).
                                  super__Vector_base<std::pair<Player_*,_Player_*>,_std::allocator<std::pair<Player_*,_Player_*>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->second + lVar3));
    poVar1 = std::operator<<(poVar1,(string *)psVar2);
    poVar1 = std::operator<<(poVar1,"}");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_50);
    lVar4 = lVar4 + 0x48;
    lVar3 = lVar3 + 0x10;
  }
  return;
}

Assistant:

void Map::showMapWithOwners() {
    for (int i = 0; i < gameMap->getVertexCount(); i++)
    {
        cout << (i) << ". " << gameMap->getVertex(i)->toString() << " --> {" << regionOwners[i].first->getPlayerName() << " , " << regionOwners[i].second->getPlayerName() << "}" << endl;
        // Player can be in all vertices except Manhattan (0) , since it can be in its subvertices
    }
}